

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_pd_is_constraint_supported
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_constraint constraint
              )

{
  raplcap_msr *ctx;
  int *piVar1;
  int ret;
  raplcap_msr *state;
  raplcap_constraint constraint_local;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  ctx = get_state(rc,pkg,die);
  if (ctx == (raplcap_msr *)0x0) {
    rc_local._4_4_ = -1;
  }
  else if (((int)constraint < 0) || (2 < (int)constraint)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    rc_local._4_4_ = -1;
  }
  else {
    rc_local._4_4_ = msr_is_constraint_supported(&ctx->ctx,zone,constraint);
  }
  return rc_local._4_4_;
}

Assistant:

int raplcap_pd_is_constraint_supported(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                                       raplcap_constraint constraint) {
  const raplcap_msr* state = get_state(rc, pkg, die);
  int ret;
  if (state == NULL) {
    return -1;
  }
  if ((int) constraint < 0 || (int) constraint >= RAPLCAP_NCONSTRAINTS) {
    errno = EINVAL;
    return -1;
  }
  ret = msr_is_constraint_supported(&state->ctx, zone, constraint);
  raplcap_log(DEBUG,
              "raplcap_pd_is_constraint_supported: pkg=%"PRIu32", die=%"PRIu32", zone=%d, constraint=%d, supported=%d\n",
              pkg, die, zone, constraint, ret);
  return ret;
}